

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSON.cxx
# Opt level: O2

bool cmCMakePresetsGraphInternal::PresetStringHelper(string *out,Value *value,cmJSONState *state)

{
  bool bVar1;
  int iVar2;
  allocator<char> local_59;
  ErrorGenerator local_58;
  string local_38;
  
  if (PresetStringHelper(std::__cxx11::string&,Json::Value_const*,cmJSONState*)::helper_abi_cxx11_
      == '\0') {
    iVar2 = __cxa_guard_acquire(&PresetStringHelper(std::__cxx11::string&,Json::Value_const*,cmJSONState*)
                                 ::helper_abi_cxx11_);
    if (iVar2 != 0) {
      local_58.super__Function_base._M_functor._8_8_ = 0;
      local_58.super__Function_base._M_functor._M_unused._M_object = JsonErrors::INVALID_STRING;
      local_58._M_invoker =
           std::
           _Function_handler<void_(const_Json::Value_*,_cmJSONState_*),_void_(*)(const_Json::Value_*,_cmJSONState_*)>
           ::_M_invoke;
      local_58.super__Function_base._M_manager =
           std::
           _Function_handler<void_(const_Json::Value_*,_cmJSONState_*),_void_(*)(const_Json::Value_*,_cmJSONState_*)>
           ::_M_manager;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"",&local_59);
      cmJSONHelperBuilder::String
                (&PresetStringHelper(std::__cxx11::string&,Json::Value_const*,cmJSONState*)::
                  helper_abi_cxx11_,&local_58,&local_38);
      std::__cxx11::string::~string((string *)&local_38);
      std::_Function_base::~_Function_base(&local_58.super__Function_base);
      __cxa_atexit(std::_Function_base::~_Function_base,
                   &PresetStringHelper(std::__cxx11::string&,Json::Value_const*,cmJSONState*)::
                    helper_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&PresetStringHelper(std::__cxx11::string&,Json::Value_const*,cmJSONState*)
                           ::helper_abi_cxx11_);
    }
  }
  bVar1 = std::
          function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
          ::operator()(&PresetStringHelper(std::__cxx11::string&,Json::Value_const*,cmJSONState*)::
                        helper_abi_cxx11_,out,value,state);
  return bVar1;
}

Assistant:

bool PresetStringHelper(std::string& out, const Json::Value* value,
                        cmJSONState* state)
{
  static auto const helper = JSONHelperBuilder::String();
  return helper(out, value, state);
}